

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

size_t bign96Sign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t ec_d_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t in_RCX;
  size_t in_RDI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  ec_d_00 = (in_RDI * 3 + 4) * 8;
  sVar1 = beltHash_keep();
  sVar2 = ecMulA_deep(in_RCX,ec_d_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar3 = zzMul_deep(2,in_RDI);
  sVar4 = zzMod_deep(in_RDI + 2,in_RDI);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return ec_d_00 + sVar1;
}

Assistant:

static size_t bign96Sign_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(3 * n + 2 * W_OF_O(13)) +
		utilMax(4,
			beltHash_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(W_OF_O(13), n),
			zzMod_deep(n + W_OF_O(13), n));
}